

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Heuristics.cpp
# Opt level: O3

int __thiscall Heuristics::evaluateStateAstar(Heuristics *this,Table currentState)

{
  Cell *pCVar1;
  short sVar2;
  char cVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  Table *pTVar8;
  int iVar9;
  int iVar10;
  int i;
  long lVar11;
  int j;
  long lVar12;
  
  lVar11 = 0;
  pTVar8 = &currentState;
  iVar4 = 0;
  iVar6 = 0;
  do {
    lVar12 = 0;
    do {
      pCVar1 = pTVar8->table[0] + lVar12;
      cVar3 = Cell::getNumber(pCVar1);
      if (cVar3 != ' ') {
        cVar3 = Cell::getNumber(pCVar1);
        iVar4 = (int)cVar3;
        uVar5 = (((uint)((iVar4 + -0x31) * 0x5555) >> 0x10) - iVar4) + 0x31;
        iVar9 = (int)(short)(((short)uVar5 >> 1) + (short)((uVar5 & 0xffff) >> 0xf)) + (int)lVar11;
        iVar7 = -iVar9;
        if (0 < iVar9) {
          iVar7 = iVar9;
        }
        sVar2 = (short)((uint)((iVar4 + -0x31) * 0x5556) >> 0x10);
        iVar10 = (int)lVar12 - (int)(short)((sVar2 - (sVar2 >> 0xf)) * -3 + (short)cVar3 + -0x31);
        iVar9 = -iVar10;
        if (0 < iVar10) {
          iVar9 = iVar10;
        }
        iVar4 = iVar4 + -0x30;
        iVar6 = iVar9 + iVar6 + iVar7;
      }
      iVar9 = iVar4 + -1;
      iVar7 = ((int)((ulong)((long)iVar9 * 0x55555555) >> 0x20) - iVar4) + 1;
      iVar10 = ((iVar7 >> 1) - (iVar7 >> 0x1f)) + (int)lVar11;
      iVar7 = -iVar10;
      if (0 < iVar10) {
        iVar7 = iVar10;
      }
      iVar10 = ((iVar9 / 3) * 3 - iVar9) + (int)lVar12;
      iVar9 = -iVar10;
      if (0 < iVar10) {
        iVar9 = iVar10;
      }
      iVar6 = iVar9 + iVar7 + iVar6;
      lVar12 = lVar12 + 1;
    } while (lVar12 != 3);
    lVar11 = lVar11 + 1;
    pTVar8 = (Table *)(pTVar8->table + 1);
  } while (lVar11 != 3);
  lVar11 = 0;
  pTVar8 = &currentState;
  do {
    lVar12 = 0;
    do {
      pCVar1 = pTVar8->table[0] + lVar12;
      cVar3 = Cell::getNumber(pCVar1);
      if (cVar3 != ' ') {
        cVar3 = Cell::getNumber(pCVar1);
        iVar4 = (int)cVar3;
        uVar5 = (((uint)((iVar4 + -0x31) * 0x5555) >> 0x10) - iVar4) + 0x31;
        iVar9 = (int)(short)(((short)uVar5 >> 1) + (short)((uVar5 & 0xffff) >> 0xf)) + (int)lVar11;
        iVar7 = -iVar9;
        if (0 < iVar9) {
          iVar7 = iVar9;
        }
        sVar2 = (short)((uint)((iVar4 + -0x31) * 0x5556) >> 0x10);
        iVar10 = (int)lVar12 - (int)(short)((sVar2 - (sVar2 >> 0xf)) * -3 + (short)cVar3 + -0x31);
        iVar9 = -iVar10;
        if (0 < iVar10) {
          iVar9 = iVar10;
        }
        iVar4 = iVar4 + -0x30;
        iVar6 = iVar9 + iVar6 + iVar7;
      }
      iVar9 = iVar4 + -1;
      iVar7 = ((int)((ulong)((long)iVar9 * 0x55555555) >> 0x20) - iVar4) + 1;
      iVar10 = ((iVar7 >> 1) - (iVar7 >> 0x1f)) + (int)lVar11;
      iVar7 = -iVar10;
      if (0 < iVar10) {
        iVar7 = iVar10;
      }
      iVar10 = ((iVar9 / 3) * 3 - iVar9) + (int)lVar12;
      iVar9 = -iVar10;
      if (0 < iVar10) {
        iVar9 = iVar10;
      }
      iVar6 = iVar9 + iVar7 + iVar6;
      lVar12 = lVar12 + 1;
    } while (lVar12 != 3);
    lVar11 = lVar11 + 1;
    pTVar8 = (Table *)(pTVar8->table + 1);
  } while (lVar11 != 3);
  return iVar6;
}

Assistant:

int Heuristics::evaluateStateAstar(Table currentState) {
    int distance = 0;
    Table initialTable = Table();
    int number = 0;
    for(int i = 0; i < HEIGHT; i++) {
        for (int j = 0; j < WIDTH; j++) {
            if (currentState.table[i][j].getNumber()  != ' ') {
                number = currentState.table[i][j].getNumber() - '0';
                distance += (abs(i - (number-1)/3) + abs(j - (number-1)%3) ) ;
            }
            distance += (abs(i - (number-1)/3) + abs(j - (number-1)%3) ) ;
        }
    }
    for(int i = 0; i < HEIGHT; i++) {
        for (int j = 0; j < WIDTH; j++) {
            if (currentState.table[i][j].getNumber()  != ' ') {
                number = currentState.table[i][j].getNumber() - '0';
                distance += (abs(i - (number-1)/3) + abs(j - (number-1)%3) ) ;
            }
            distance += (abs(i - (number-1)/3) + abs(j - (number-1)%3) ) ;
        }
    }
    return distance;
}